

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_bytes.cpp
# Opt level: O2

DataFileType duckdb::MagicBytes::CheckMagicBytes(FileSystem *fs,string *path)

{
  bool bVar1;
  pointer this;
  DataFileType DVar2;
  undefined1 auVar3 [16];
  FileOpenFlags FVar4;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_40;
  char buffer [16];
  
  DVar2 = DUCKDB_FILE;
  if (path->_M_string_length != 0) {
    bVar1 = ::std::operator==(path,":memory:");
    if (!bVar1) {
      FVar4.lock = NO_LOCK;
      FVar4.compression = UNCOMPRESSED;
      FVar4._10_6_ = 0;
      FVar4.flags = 0x80;
      FVar4 = FileOpenFlags::operator|((FileOpenFlags *)FileFlags::FILE_FLAGS_READ,FVar4);
      DVar2 = FILE_DOES_NOT_EXIST;
      (*fs->_vptr_FileSystem[2])(&local_40,fs,path,FVar4.flags,(ulong)FVar4._8_2_,0);
      if (local_40._M_head_impl != (FileHandle *)0x0) {
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        this = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                           *)&local_40);
        FileHandle::Read(this,buffer,0x10);
        auVar3[0] = -(buffer[0] == 'S');
        auVar3[1] = -(buffer[1] == 'Q');
        auVar3[2] = -(buffer[2] == 'L');
        auVar3[3] = -(buffer[3] == 'i');
        auVar3[4] = -(buffer[4] == 't');
        auVar3[5] = -(buffer[5] == 'e');
        auVar3[6] = -(buffer[6] == ' ');
        auVar3[7] = -(buffer[7] == 'f');
        auVar3[8] = -(buffer[8] == 'o');
        auVar3[9] = -(buffer[9] == 'r');
        auVar3[10] = -(buffer[10] == 'm');
        auVar3[0xb] = -(buffer[0xb] == 'a');
        auVar3[0xc] = -(buffer[0xc] == 't');
        auVar3[0xd] = -(buffer[0xd] == ' ');
        auVar3[0xe] = -(buffer[0xe] == '3');
        auVar3[0xf] = -(buffer[0xf] == '\0');
        if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
          DVar2 = SQLITE_FILE;
        }
        else {
          DVar2 = PARQUET_FILE;
          if (buffer._0_4_ != 0x31524150) {
            DVar2 = buffer._8_4_ == 0x4b435544;
          }
        }
        if (local_40._M_head_impl != (FileHandle *)0x0) {
          (*(local_40._M_head_impl)->_vptr_FileHandle[1])();
        }
      }
    }
  }
  return DVar2;
}

Assistant:

DataFileType MagicBytes::CheckMagicBytes(FileSystem &fs, const string &path) {
	if (path.empty() || path == IN_MEMORY_PATH) {
		return DataFileType::DUCKDB_FILE;
	}
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS);
	if (!handle) {
		return DataFileType::FILE_DOES_NOT_EXIST;
	}

	constexpr const idx_t MAGIC_BYTES_READ_SIZE = 16;
	char buffer[MAGIC_BYTES_READ_SIZE] = {};

	handle->Read(buffer, MAGIC_BYTES_READ_SIZE);
	if (memcmp(buffer, "SQLite format 3\0", 16) == 0) {
		return DataFileType::SQLITE_FILE;
	}
	if (memcmp(buffer, "PAR1", 4) == 0) {
		return DataFileType::PARQUET_FILE;
	}
	if (memcmp(buffer + MainHeader::MAGIC_BYTE_OFFSET, MainHeader::MAGIC_BYTES, MainHeader::MAGIC_BYTE_SIZE) == 0) {
		return DataFileType::DUCKDB_FILE;
	}
	return DataFileType::FILE_DOES_NOT_EXIST;
}